

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureDescWrapper::SetCombinedSamplerSuffix
          (PipelineResourceSignatureDescWrapper *this,char *Suffix)

{
  int iVar1;
  Char *pCVar2;
  char (*in_RCX) [18];
  undefined1 local_38 [8];
  string msg;
  char *Suffix_local;
  PipelineResourceSignatureDescWrapper *this_local;
  
  msg.field_2._8_8_ = Suffix;
  if (Suffix == (char *)0x0) {
    FormatString<char[26],char[18]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",(char (*) [26])0xcc734a,
               in_RCX);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"SetCombinedSamplerSuffix",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x107);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (((this->m_Desc).UseCombinedTextureSamplers & 1U) == 0) {
    std::__cxx11::string::operator=
              ((string *)&this->m_CombinedSamplerSuffix,(char *)msg.field_2._8_8_);
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    (this->m_Desc).CombinedSamplerSuffix = pCVar2;
    (this->m_Desc).UseCombinedTextureSamplers = true;
  }
  else {
    iVar1 = strcmp((this->m_Desc).CombinedSamplerSuffix,(char *)msg.field_2._8_8_);
    if (iVar1 != 0) {
      LogError<true,char[30],char_const*,char[38],char_const*,char[110]>
                (false,"SetCombinedSamplerSuffix",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                 ,0x10d,(char (*) [30])"New Combined Sampler Suffix (",
                 (char **)((long)&msg.field_2 + 8),
                 (char (*) [38])") does not match the current suffix (",
                 &(this->m_Desc).CombinedSamplerSuffix,
                 (char (*) [110])
                 "). This indicates that the pipeline state uses shaders with different sampler suffixes, which is not allowed."
                );
    }
  }
  return;
}

Assistant:

void SetCombinedSamplerSuffix(const char* Suffix)
    {
        VERIFY_EXPR(Suffix != nullptr);
        if (m_Desc.UseCombinedTextureSamplers)
        {
            if (strcmp(m_Desc.CombinedSamplerSuffix, Suffix) != 0)
            {
                LOG_ERROR_AND_THROW("New Combined Sampler Suffix (", Suffix, ") does not match the current suffix (", m_Desc.CombinedSamplerSuffix,
                                    "). This indicates that the pipeline state uses shaders with different sampler suffixes, which is not allowed.");
            }
        }
        else
        {
            m_CombinedSamplerSuffix           = Suffix;
            m_Desc.CombinedSamplerSuffix      = m_CombinedSamplerSuffix.c_str();
            m_Desc.UseCombinedTextureSamplers = true;
        }
    }